

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>::
insert_simplex_raw<std::vector<short,std::allocator<short>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this,
          vector<short,_std::allocator<short>_> *simplex,Filtration_value *filtration)

{
  short sVar1;
  bool bVar2;
  Vertex_handle VVar3;
  int iVar4;
  pointer ppVar5;
  reference psVar6;
  type tVar7;
  undefined8 extraout_RDX;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar8;
  undefined1 local_98 [4];
  int dim;
  undefined1 local_81;
  undefined8 *local_80;
  undefined1 local_78 [40];
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_50;
  __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_> local_48;
  const_iterator vi;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  res_insert;
  Siblings *curr_sib;
  Filtration_value *filtration_local;
  vector<short,_std::allocator<short>_> *simplex_local;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *this_local;
  
  res_insert._8_8_ =
       &simplex[2].super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage;
  std::
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  ::
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool,_true>
            ((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
              *)&vi);
  local_48._M_current =
       (short *)std::vector<short,_std::allocator<short>_>::begin
                          ((vector<short,_std::allocator<short>_> *)filtration);
  while( true ) {
    local_78._32_8_ =
         std::vector<short,_std::allocator<short>_>::end
                   ((vector<short,_std::allocator<short>_> *)filtration);
    local_50 = std::
               prev<__gnu_cxx::__normal_iterator<short_const*,std::vector<short,std::allocator<short>>>>
                         ((__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>
                           )local_78._32_8_,1);
    bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
    if (!bVar2) {
      psVar6 = __gnu_cxx::
               __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_48);
      sVar1 = *psVar6;
      VVar3 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>
                           *)simplex);
      local_81 = 0;
      if (sVar1 == VVar3) {
        local_80 = (undefined8 *)__cxa_allocate_exception(8);
        local_81 = 1;
        *local_80 = "cannot use the dummy null_vertex() as a real vertex";
        __cxa_throw(local_80,&char_const*::typeinfo,0);
      }
      psVar6 = __gnu_cxx::
               __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
               operator*(&local_48);
      insert_node_<true,false,true,Gudhi::Vector_filtration_value_const&>
                ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *)
                 local_98,(Siblings *)simplex,res_insert._8_2_,
                 (Vector_filtration_value *)(ulong)(uint)(int)*psVar6);
      std::
      pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
      ::operator=((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
                   *)&vi,(type)local_98);
      if (((byte)res_insert.first.m_iit.members_.nodeptr_ & 1) != 0) {
        tVar7 = boost::size<std::vector<short,std::allocator<short>>>
                          ((vector<short,_std::allocator<short>_> *)filtration);
        iVar4 = (int)tVar7 + -1;
        if (*(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage < iVar4) {
          *(int *)&simplex[5].super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = iVar4;
        }
      }
      std::
      pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
      ::
      pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool,_true>
                ((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
                  *)this,(pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
                          *)&vi);
      pVar8._8_8_ = extraout_RDX;
      pVar8.first.m_iit.members_.nodeptr_ =
           (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
            )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
              )this;
      return pVar8;
    }
    psVar6 = __gnu_cxx::
             __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&local_48);
    sVar1 = *psVar6;
    VVar3 = null_vertex((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *
                        )simplex);
    local_78[0x17] = 0;
    if (sVar1 == VVar3) break;
    psVar6 = __gnu_cxx::
             __normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
             operator*(&local_48);
    insert_node_<false,true,false,Gudhi::Vector_filtration_value_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured> *)local_78
               ,(Siblings *)simplex,res_insert._8_2_,
               (Vector_filtration_value *)(ulong)(uint)(int)*psVar6);
    std::
    pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
    ::operator=((pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
                 *)&vi,(type)local_78);
    ppVar5 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
             ::operator->((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                           *)&vi);
    res_insert._8_8_ =
         Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_full_featured>_>
         ::children(&ppVar5->second);
    __gnu_cxx::__normal_iterator<const_short_*,_std::vector<short,_std::allocator<short>_>_>::
    operator++(&local_48);
  }
  local_78._24_8_ = __cxa_allocate_exception(8);
  local_78[0x17] = 1;
  *(char **)local_78._24_8_ = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(local_78._24_8_,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }